

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::setupRevolute
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *jointAxis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool disableParentCollision)

{
  int *piVar1;
  btVector3 *pbVar2;
  btQuaternion *pbVar3;
  btSpatialMotionVector *pbVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  btMultibodyLink *pbVar7;
  undefined8 uVar8;
  btVector3 bVar9;
  
  uVar5 = this->m_dofCount;
  uVar6 = this->m_posVarCnt;
  this->m_dofCount = uVar5 + 1;
  this->m_posVarCnt = uVar6 + 1;
  pbVar7 = (this->m_links).m_data;
  pbVar7[i].m_mass = mass;
  uVar8 = *(undefined8 *)(inertia->m_floats + 2);
  pbVar2 = &pbVar7[i].m_inertiaLocal;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar8;
  pbVar7 = (this->m_links).m_data;
  pbVar7[i].m_parent = parent;
  uVar8 = *(undefined8 *)((rotParentToThis->super_btQuadWord).m_floats + 2);
  pbVar3 = &pbVar7[i].m_zeroRotParentToThis;
  *(undefined8 *)(pbVar3->super_btQuadWord).m_floats =
       *(undefined8 *)(rotParentToThis->super_btQuadWord).m_floats;
  *(undefined8 *)((pbVar3->super_btQuadWord).m_floats + 2) = uVar8;
  uVar8 = *(undefined8 *)(jointAxis->m_floats + 2);
  pbVar4 = (this->m_links).m_data[i].m_axes;
  *(undefined8 *)(pbVar4->m_topVec).m_floats = *(undefined8 *)jointAxis->m_floats;
  *(undefined8 *)((pbVar4->m_topVec).m_floats + 2) = uVar8;
  pbVar7 = (this->m_links).m_data;
  bVar9 = btVector3::cross(jointAxis,thisPivotToThisComOffset);
  *&pbVar7[i].m_axes[0].m_bottomVec.m_floats = bVar9.m_floats;
  uVar8 = *(undefined8 *)(thisPivotToThisComOffset->m_floats + 2);
  pbVar2 = &(this->m_links).m_data[i].m_dVector;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)thisPivotToThisComOffset->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar8;
  uVar8 = *(undefined8 *)(parentComToThisPivotOffset->m_floats + 2);
  pbVar2 = &(this->m_links).m_data[i].m_eVector;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)parentComToThisPivotOffset->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar8;
  pbVar7 = (this->m_links).m_data;
  pbVar7[i].m_jointType = eRevolute;
  pbVar7[i].m_dofCount = 1;
  pbVar7[i].m_posVarCount = 1;
  pbVar7[i].m_jointPos[0] = 0.0;
  pbVar7[i].m_jointTorque[0] = 0.0;
  if (disableParentCollision) {
    piVar1 = &pbVar7[i].m_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  btMultibodyLink::updateCacheMultiDof(pbVar7 + i,(btScalar *)0x0);
  updateLinksDofOffsets(this);
  return;
}

Assistant:

void btMultiBody::setupRevolute(int i,
                              btScalar mass,
                              const btVector3 &inertia,
                              int parent,
                              const btQuaternion &rotParentToThis,
                              const btVector3 &jointAxis,
                              const btVector3 &parentComToThisPivotOffset,
                              const btVector3 &thisPivotToThisComOffset,
							  bool disableParentCollision)
{
	m_dofCount += 1;
	m_posVarCnt += 1;
	
    m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;
    m_links[i].setAxisTop(0, jointAxis);
    m_links[i].setAxisBottom(0, jointAxis.cross(thisPivotToThisComOffset));
    m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;

	m_links[i].m_jointType = btMultibodyLink::eRevolute;
	m_links[i].m_dofCount = 1;
	m_links[i].m_posVarCount = 1;	
	m_links[i].m_jointPos[0] = 0.f;
	m_links[i].m_jointTorque[0] = 0.f;

	if (disableParentCollision)
		m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;
    //
	m_links[i].updateCacheMultiDof();
	//
	updateLinksDofOffsets();
}